

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_crypt.c
# Opt level: O2

int ulp_ring_decrypt(ulp_ring_ciphertext *ciphertext,ulp_ring_private_key *priv_key,uint8_t **msg_p)

{
  ulong n;
  size_t l;
  int iVar1;
  uint64_t *result;
  uint8_t *out;
  size_t i;
  size_t sVar2;
  int iVar3;
  
  iVar3 = -1;
  if (priv_key != (ulp_ring_private_key *)0x0 && ciphertext != (ulp_ring_ciphertext *)0x0) {
    n = ciphertext->n;
    if (n == priv_key->n) {
      result = (uint64_t *)malloc(n * 8);
      out = (uint8_t *)malloc(((n >> 3) + 1) - (ulong)((n & 7) == 0));
      if (((result != (uint64_t *)0x0) && (out != (uint8_t *)0x0)) &&
         (iVar1 = poly_mulmod(priv_key->s,ciphertext->c1,n,priv_key->q,result), iVar1 == 0)) {
        l = priv_key->n;
        for (sVar2 = 0; l != sVar2; sVar2 = sVar2 + 1) {
          result[sVar2] = (ciphertext->c2[sVar2] + result[sVar2]) % priv_key->q;
        }
        decode(result,out,l,priv_key->q);
        free(result);
        *msg_p = out;
        return 0;
      }
      free(result);
      free(out);
    }
    else {
      iVar3 = -2;
    }
  }
  return iVar3;
}

Assistant:

int ulp_ring_decrypt(ulp_ring_ciphertext* ciphertext, ulp_ring_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->n / 8;
    if(num_bytes * 8 != priv_key->n)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->n * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL)
        goto fail;

    // s * c1 + c2
    if(poly_mulmod(priv_key->s, ciphertext->c1, priv_key->n, priv_key->q, tmp) != 0)
        goto fail;
    for(size_t i = 0; i < priv_key->n; i++) {
        tmp[i] = (tmp[i] + ciphertext->c2[i]) % priv_key->q;
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->n, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;


    fail:
        free(tmp);
        free(msg);
        return -1;

}